

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O1

int mk_fifo_worker_read(void *event)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  void *pvVar4;
  ssize_t sVar5;
  ulong uVar6;
  long lVar7;
  char *__s;
  int iVar8;
  size_t __size;
  
  iVar3 = (int)*(long *)((long)event + 0x70) - (int)*(undefined8 *)((long)event + 0x68);
  if (iVar3 < 2) {
    __size = *(long *)((long)event + 0x70) + 0x4000;
    pvVar4 = realloc(*(void **)((long)event + 0x60),__size);
    if (pvVar4 == (void *)0x0 && __size != 0) {
      perror("realloc");
    }
    if (pvVar4 == (void *)0x0) {
      __s = "realloc";
      goto LAB_001077ca;
    }
    *(void **)((long)event + 0x60) = pvVar4;
    *(size_t *)((long)event + 0x70) = __size;
    iVar3 = (int)__size - (int)*(undefined8 *)((long)event + 0x68);
  }
  sVar5 = read(*(int *)((long)event + 0x4c),
               (void *)(*(long *)((long)event + 0x60) + *(long *)((long)event + 0x68)),(long)iVar3);
  iVar3 = -1;
  if (sVar5 != 0) {
    if (sVar5 == -1) {
      __s = "read";
LAB_001077ca:
      perror(__s);
    }
    uVar6 = sVar5 + *(long *)((long)event + 0x68);
    *(ulong *)((long)event + 0x68) = uVar6;
    if (uVar6 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        puVar2 = *(uint **)((long)event + 0x60);
        if (uVar6 < (ulong)*puVar2 + 8) {
          return 0;
        }
        for (lVar7 = *(long *)(*(long *)((long)event + 0x78) + 0x40);
            lVar7 != *(long *)((long)event + 0x78) + 0x38; lVar7 = *(long *)(lVar7 + 8)) {
          if (*(ushort *)(lVar7 + -0x18) == *(ushort *)((long)puVar2 + 6)) {
            lVar7 = lVar7 + -0x18;
            goto LAB_0010775d;
          }
        }
        lVar7 = 0;
LAB_0010775d:
        if (lVar7 == 0) {
          fprintf(_stderr,"[fifo worker read] invalid queue id %i\n",
                  (ulong)*(ushort *)((long)puVar2 + 6));
        }
        else if (*(code **)(lVar7 + 0x28) != (code *)0x0) {
          (**(code **)(lVar7 + 0x28))(lVar7,puVar2 + 2,(ulong)*puVar2,*(undefined8 *)(lVar7 + 0x30))
          ;
        }
        puVar2 = *(uint **)((long)event + 0x60);
        uVar1 = *puVar2;
        iVar8 = (int)((ulong)uVar1 + 8);
        memmove(puVar2,(void *)((long)puVar2 + (long)iVar8),
                (long)(*(int *)((long)event + 0x68) - iVar8));
        uVar6 = *(long *)((long)event + 0x68) - ((ulong)uVar1 + 8);
        *(ulong *)((long)event + 0x68) = uVar6;
      } while (uVar6 != 0);
    }
  }
  return iVar3;
}

Assistant:

int mk_fifo_worker_read(void *event)
{
    int available;
    char *tmp;
    size_t size;
    ssize_t bytes;
    struct mk_fifo_msg *fm;
    struct mk_fifo_worker *fw;
    struct mk_fifo_queue *fq;

    fw = (struct mk_fifo_worker *) event;

    /* Check available space */
    available = fw->buf_size - fw->buf_len;
    if (available <= 1) {
        size = fw->buf_size + (MK_FIFO_BUF_SIZE / 2);
        tmp = mk_mem_realloc(fw->buf_data, size);
        if (!tmp) {
            perror("realloc");
            return -1;
        }
        fw->buf_data = tmp;
        fw->buf_size = size;
        available = fw->buf_size - fw->buf_len;
    }

    /* Read data from pipe */
#ifdef _WIN32
    bytes = recv(fw->channel[0], fw->buf_data + fw->buf_len, available, 0);
#else
    bytes = read(fw->channel[0], fw->buf_data + fw->buf_len, available);
#endif

    if (bytes == 0) {
        return -1;
    }
    else if (bytes == -1){
        perror("read");
        return -1;
    }

    fw->buf_len += bytes;

    /* Find messages and trigger callbacks */
    while (fw->buf_len > 0) {
        if (fifo_is_msg_ready(fw) == MK_TRUE) {
            /* we got a complete message */
            fm = (struct mk_fifo_msg *) fw->buf_data;
            fq = mk_fifo_queue_get(fw->fifo, fm->queue_id);
            if (!fq) {
                /* Invalid queue */
                fprintf(stderr, "[fifo worker read] invalid queue id %i\n",
                        fm->queue_id);
                fifo_drop_msg(fw);
                continue;
            }

            /* Trigger callback if any */
            if (fq->cb_message) {
                fq->cb_message(fq, fm->data, fm->length, fq->data);
            }
            fifo_drop_msg(fw);
        }
        else {
            /* msg not ready */
            break;
        }
    }

    return 0;
}